

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::addTokenFilter
          (QPDFObjectHandle *this,shared_ptr<QPDFObjectHandle::TokenFilter> *filter)

{
  shared_ptr<QPDFObjectHandle::TokenFilter> local_38;
  QPDFObjectHandle local_28;
  shared_ptr<QPDFObjectHandle::TokenFilter> *local_18;
  shared_ptr<QPDFObjectHandle::TokenFilter> *filter_local;
  QPDFObjectHandle *this_local;
  
  local_18 = filter;
  filter_local = (shared_ptr<QPDFObjectHandle::TokenFilter> *)this;
  as_stream(&local_28,(typed)this);
  std::shared_ptr<QPDFObjectHandle::TokenFilter>::shared_ptr(&local_38,filter);
  ::qpdf::Stream::addTokenFilter((Stream *)&local_28,&local_38);
  std::shared_ptr<QPDFObjectHandle::TokenFilter>::~shared_ptr(&local_38);
  ::qpdf::Stream::~Stream((Stream *)&local_28);
  return;
}

Assistant:

void
QPDFObjectHandle::addTokenFilter(std::shared_ptr<TokenFilter> filter)
{
    return as_stream(error).addTokenFilter(filter);
}